

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCppFile.h
# Opt level: O2

void __thiscall cppforth::Forth::readLine(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  uint uVar1;
  uint uVar2;
  long lVar3;
  size_t sVar4;
  Cell *pCVar5;
  pointer src;
  uint Value;
  allocator<char> local_69;
  shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_> f;
  vector<char,_std::allocator<char>_> readBuffer;
  
  requireDStackDepth(this,3,"READ-LINE");
  this_00 = &this->dStack;
  uVar1 = ForthStack<unsigned_int>::getTop(this_00);
  std::__cxx11::string::string<std::allocator<char>>((string *)&readBuffer,"READ-LINE",&local_69);
  GetFileHandle((Forth *)&f,(Cell)this,(string *)(ulong)uVar1,(errorCodes)&readBuffer);
  std::__cxx11::string::~string((string *)&readBuffer);
  uVar1 = ForthStack<unsigned_int>::getTop(this_00,1);
  uVar2 = ForthStack<unsigned_int>::getTop(this_00,2);
  if (uVar1 == 0) {
    uVar1 = this->True;
    uVar2 = 0;
    Value = 0;
  }
  else {
    std::vector<char,_std::allocator<char>_>::vector(&readBuffer,(ulong)uVar1 + 2,&local_69);
    lVar3 = *(long *)(*(long *)f.
                               super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr + -0x18);
    if (*(int *)(f.
                 super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr + lVar3 + 0x20) == 4) {
      std::ios::clear((int)f.
                           super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr + (int)lVar3);
      lVar3 = *(long *)(*(long *)f.
                                 super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr + -0x18);
    }
    std::ios::clear((int)lVar3 +
                    (int)f.
                         super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr);
    std::istream::getline
              ((char *)f.
                       super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr,
               (long)readBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start);
    src = readBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
          ._M_start;
    sVar4 = strlen(readBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start);
    Value = (uint)sVar4;
    if ((sVar4 & 0xffffffff) == (ulong)uVar1) {
      if (*(int *)(f.
                   super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr +
                  *(long *)(*(long *)f.
                                     super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr + -0x18) + 0x20) == 4) {
        std::ios::clear((int)f.
                             super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr +
                        (int)*(long *)(*(long *)f.
                                                super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_ptr + -0x18));
        src = readBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start;
      }
    }
    moveIntoDataSpace(this,uVar2,src,sVar4 & 0xffffffff);
    pCVar5 = &this->False;
    if ((*(uint *)(f.
                   super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr +
                  *(long *)(*(long *)f.
                                     super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr + -0x18) + 0x20) & 2) == 0) {
      pCVar5 = &this->True;
    }
    if (Value != 0) {
      pCVar5 = &this->True;
    }
    uVar1 = *pCVar5;
    uVar2 = -(*(uint *)(f.
                        super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr +
                       *(long *)(*(long *)f.
                                          super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr + -0x18) + 0x20) & 1) & 0xffffffb9;
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              (&readBuffer.super__Vector_base<char,_std::allocator<char>_>);
  }
  ForthStack<unsigned_int>::setTop(this_00,0,uVar2);
  ForthStack<unsigned_int>::setTop(this_00,1,uVar1);
  ForthStack<unsigned_int>::setTop(this_00,2,Value);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&f.
              super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return;
}

Assistant:

void readLine() {
	REQUIRE_DSTACK_DEPTH(3, "READ-LINE");
	auto h = (dStack.getTop()); 
	auto f = GetFileHandle(h, "READ-LINE", errorReadLine);
	auto length = SIZE_T(dStack.getTop(1));
	auto caddr = (dStack.getTop(2));
	Cell ior = 0;
	Cell flag = True;
	Cell u2 = 0;
	if (length > 0) {
		std::vector<char> readBuffer(length+2);
		if(f->rdstate() == std::ios::failbit) {
			f->clear(); // EOL is not read. Need to clear failbit flag and continue reading
		}
		f->clear();
		f->getline(&readBuffer[0], static_cast<std::streamsize>(length+1)); // add termination 0 to char counter
		auto realLength = static_cast<Cell>(std::strlen(&readBuffer[0]));
		if (realLength == (length ) && f->rdstate() == std::ios::failbit) {
			f->clear(); // EOL is not read. Need to clear failbit flag and continue reading
		}
		length = realLength;
		auto infoLength = f->gcount();
		moveIntoDataSpace(caddr, &readBuffer[0], length);
		u2 = static_cast<Cell>(length);
		if (f->rdstate() & std::ios::eofbit && u2==0) {
			flag = False; // EOF
		}
		else {
			flag = True;
		}
		ior = f->bad() ? Cell(errorReadLine) : 0;
	}
	
	dStack.setTop(0, ior);
	dStack.setTop(1, flag);
	dStack.setTop(2, u2);
}